

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::finalize(Federate *this)

{
  string_view message;
  Modes MVar1;
  bool bVar2;
  undefined8 uVar3;
  element_type *peVar4;
  long in_RDI;
  iteration_time iVar5;
  exception *anon_var_0;
  handle asyncInfo;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_fffffffffffffed8;
  Federate *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> *plVar6;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  future<TimeRepresentation<count_time<9,_long>_>_> *in_stack_fffffffffffffef8;
  future<bool> *in_stack_ffffffffffffff00;
  Federate *in_stack_ffffffffffffff10;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_98;
  baseType local_80;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_78;
  baseType local_60;
  IterationResult local_58;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_50 [2];
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_20;
  
  MVar1 = std::atomic<helics::Federate::Modes>::load
                    ((atomic<helics::Federate::Modes> *)(in_RDI + 8),seq_cst);
  switch(MVar1) {
  case STARTUP:
  case INITIALIZING:
  case EXECUTING:
  case FINISHED:
    break;
  case FINALIZE:
  case ERROR_STATE:
    return;
  case PENDING_INIT:
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x340a82);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_fffffffffffffed8);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_20);
    std::future<bool>::get(in_stack_ffffffffffffff00);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x340b2b);
    break;
  case PENDING_EXEC:
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x340b50);
    plVar6 = local_50;
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_fffffffffffffed8);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(plVar6);
    iVar5 = std::future<helics::iteration_time>::get
                      ((future<helics::iteration_time> *)in_stack_fffffffffffffef8);
    local_60 = (baseType)iVar5.grantedTime.internalTimeCode;
    local_58 = iVar5.state;
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x340bab);
    break;
  case PENDING_TIME:
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x340be4);
    plVar6 = &local_78;
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_fffffffffffffed8);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(plVar6);
    local_80 = (baseType)
               std::future<TimeRepresentation<count_time<9,_long>_>_>::get
                         (in_stack_fffffffffffffef8);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x340c30);
    break;
  case PENDING_ITERATIVE_TIME:
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x340c69);
    plVar6 = &local_98;
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_fffffffffffffed8);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(plVar6);
    std::future<helics::iteration_time>::get
              ((future<helics::iteration_time> *)in_stack_fffffffffffffef8);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x340cc4);
    break;
  case PENDING_FINALIZE:
    finalizeComplete(in_stack_ffffffffffffff10);
    return;
  default:
    uVar3 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffee8);
    message._M_str = (char *)in_stack_ffffffffffffff00;
    message._M_len = (size_t)in_stack_fffffffffffffef8;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               message);
    __cxa_throw(uVar3,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x18));
  if (bVar2) {
    peVar4 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x340d71);
    (*peVar4->_vptr_Core[0x12])(peVar4,(ulong)*(uint *)(in_RDI + 0x10));
  }
  finalizeOperations(in_stack_fffffffffffffee0);
  return;
}

Assistant:

void Federate::finalize()
{  // since finalize is called in the destructor we can't allow any potential virtual function calls
    switch (currentMode.load()) {
        case Modes::STARTUP:
        case Modes::INITIALIZING:
        case Modes::EXECUTING:
        case Modes::FINISHED:
            break;
        case Modes::PENDING_INIT: {
            auto asyncInfo = asyncCallInfo->lock();
            try {
                asyncInfo->initFuture.get();
            }
            catch (const std::exception&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
        } break;
        case Modes::PENDING_EXEC:
            asyncCallInfo->lock()->execFuture.get();
            break;
        case Modes::PENDING_TIME:
            asyncCallInfo->lock()->timeRequestFuture.get();
            break;
        case Modes::PENDING_ITERATIVE_TIME:
            asyncCallInfo->lock()
                ->timeRequestIterativeFuture.get();  // I don't care about the return any more
            break;
        case Modes::FINALIZE:
        case Modes::ERROR_STATE:
            return;
            // do nothing
        case Modes::PENDING_FINALIZE:
            finalizeComplete();
            return;
        default:
            throw(InvalidFunctionCall("cannot call finalize in present state"));  // LCOV_EXCL_LINE
    }
    if (coreObject) {
        coreObject->finalize(fedID);
    }
    finalizeOperations();
}